

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

int __thiscall
gl4cts::ShaderSubroutine::FunctionalTest5::verify
          (FunctionalTest5 *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen
          )

{
  bool bVar1;
  undefined7 extraout_var;
  undefined7 uVar2;
  vec4<float> *in_stack_00000008;
  vec4<float> *in_stack_00000010;
  vec4<unsigned_int> *in_stack_00000018;
  undefined1 local_3d;
  undefined1 local_3c;
  undefined1 local_3b;
  bool result;
  vec4<float> *first_routine_expected_result_local;
  vec4<unsigned_int> *fourth_routine_result_local;
  vec4<float> *third_routine_result_local;
  vec4<float> *second_routine_result_local;
  vec4<float> *first_routine_result_local;
  FunctionalTest5 *this_local;
  
  bVar1 = Utils::vec4<float>::operator==((vec4<float> *)ctx,(vec4<float> *)tbslen);
  local_3b = false;
  if (bVar1) {
    local_3b = Utils::vec4<float>::operator==((vec4<float> *)sig,in_stack_00000008);
  }
  local_3c = false;
  if (local_3b != false) {
    local_3c = Utils::vec4<float>::operator==((vec4<float> *)siglen,in_stack_00000010);
  }
  uVar2 = 0;
  local_3d = false;
  if (local_3c != false) {
    local_3d = Utils::vec4<unsigned_int>::operator==((vec4<unsigned_int> *)tbs,in_stack_00000018);
    uVar2 = extraout_var;
  }
  return (int)CONCAT71(uVar2,local_3d);
}

Assistant:

bool FunctionalTest5::verify(const Utils::vec4<glw::GLfloat>& first_routine_result,
							 const Utils::vec4<glw::GLfloat>& second_routine_result,
							 const Utils::vec4<glw::GLfloat>& third_routine_result,
							 const Utils::vec4<glw::GLuint>&  fourth_routine_result,
							 const Utils::vec4<glw::GLfloat>& first_routine_expected_result,
							 const Utils::vec4<glw::GLfloat>& second_routine_expected_result,
							 const Utils::vec4<glw::GLfloat>& third_routine_expected_result,
							 const Utils::vec4<glw::GLuint>&  fourth_routine_expected_result) const
{
	bool result = true;

	result = result && (first_routine_result == first_routine_expected_result);
	result = result && (second_routine_result == second_routine_expected_result);
	result = result && (third_routine_result == third_routine_expected_result);
	result = result && (fourth_routine_result == fourth_routine_expected_result);

	return result;
}